

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O0

void predict<true>(mf *data,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  uchar uVar3;
  undefined1 uVar4;
  bool bVar5;
  float *pfVar6;
  reference pbVar7;
  uchar *puVar8;
  undefined1 *puVar9;
  size_t sVar10;
  v_array<unsigned_char> *in_RDX;
  long in_RDI;
  float fVar11;
  float x_dot_r;
  float x_dot_l;
  size_t k;
  int right_ns;
  int left_ns;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  float prediction;
  size_t in_stack_00000178;
  v_array<float> *in_stack_00000180;
  shared_data *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  uchar in_stack_ffffffffffffff97;
  float in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  long local_28;
  undefined1 local_1d;
  float local_1c;
  v_array<unsigned_char> *local_18;
  long local_8;
  
  local_1c = 0.0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  v_array<float>::resize(in_stack_00000180,in_stack_00000178);
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,(example *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  fVar11 = *(float *)&local_18[0x345]._end;
  pfVar6 = v_array<float>::operator[]((v_array<float> *)(local_8 + 0x28),0);
  *pfVar6 = fVar11;
  local_1c = *(float *)&local_18[0x345]._end + local_1c;
  copy_array<unsigned_char>
            ((v_array<unsigned_char> *)CONCAT44(fVar11,in_stack_ffffffffffffffa0),
             (v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  v_array<unsigned_char>::clear
            ((v_array<unsigned_char> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
            );
  local_1d = 0;
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
             ,(uchar *)in_stack_ffffffffffffff88);
  local_28 = local_8;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_ffffffffffffff88);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff88), bVar5) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_30);
    puVar8 = (uchar *)std::__cxx11::string::operator[]((ulong)pbVar7);
    uVar3 = *puVar8;
    puVar9 = (undefined1 *)std::__cxx11::string::operator[]((ulong)pbVar7);
    uVar4 = *puVar9;
    sVar10 = features::size((features *)0x24870a);
    if ((sVar10 != 0) && (sVar10 = features::size((features *)0x24872e), sVar10 != 0)) {
      for (local_50 = 1; local_50 <= *(ulong *)(local_8 + 0x18); local_50 = local_50 + 1) {
        in_stack_ffffffffffffff97 = uVar3;
        puVar8 = v_array<unsigned_char>::operator[](local_18,0);
        *puVar8 = in_stack_ffffffffffffff97;
        LEARNER::learner<char,_example>::predict
                  ((learner<char,_example> *)CONCAT44(fVar11,in_stack_ffffffffffffffa0),
                   (example *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        fVar1 = *(float *)&local_18[0x345]._end;
        in_stack_ffffffffffffff98 = fVar1;
        pfVar6 = v_array<float>::operator[]((v_array<float> *)(local_8 + 0x28),local_50 * 2 - 1);
        *pfVar6 = in_stack_ffffffffffffff98;
        in_stack_ffffffffffffff9c = CONCAT13(uVar4,(int3)in_stack_ffffffffffffff9c);
        puVar8 = v_array<unsigned_char>::operator[](local_18,0);
        *puVar8 = (uchar)((uint)in_stack_ffffffffffffff9c >> 0x18);
        LEARNER::learner<char,_example>::predict
                  ((learner<char,_example> *)CONCAT44(fVar11,in_stack_ffffffffffffffa0),
                   (example *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        fVar2 = *(float *)&local_18[0x345]._end;
        in_stack_ffffffffffffffa0 = fVar2;
        pfVar6 = v_array<float>::operator[]((v_array<float> *)(local_8 + 0x28),local_50 << 1);
        *pfVar6 = in_stack_ffffffffffffffa0;
        local_1c = fVar1 * fVar2 + local_1c;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  copy_array<unsigned_char>
            ((v_array<unsigned_char> *)CONCAT44(fVar11,in_stack_ffffffffffffffa0),
             (v_array<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  *(float *)&local_18[0x345]._end = local_1c;
  fVar11 = GD::finalize_prediction(in_stack_ffffffffffffff88,0.0);
  *(float *)&local_18[0x342].end_array = fVar11;
  return;
}

Assistant:

void predict(mf& data, single_learner& base, example& ec)
{
  float prediction = 0;
  if (cache_sub_predictions)
    data.sub_predictions.resize(2 * data.rank + 1);

  // predict from linear terms
  base.predict(ec);

  // store linear prediction
  if (cache_sub_predictions)
    data.sub_predictions[0] = ec.partial_prediction;
  prediction += ec.partial_prediction;

  // store namespace indices
  copy_array(data.predict_indices, ec.indices);

  // erase indices
  ec.indices.clear();
  ec.indices.push_back(0);

  // add interaction terms to prediction
  for (string& i : data.pairs)
  {
    int left_ns = (int)i[0];
    int right_ns = (int)i[1];

    if (ec.feature_space[left_ns].size() > 0 && ec.feature_space[right_ns].size() > 0)
    {
      for (size_t k = 1; k <= data.rank; k++)
      {
        ec.indices[0] = left_ns;

        // compute l^k * x_l using base learner
        base.predict(ec, k);
        float x_dot_l = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k - 1] = x_dot_l;

        // set example to right namespace only
        ec.indices[0] = right_ns;

        // compute r^k * x_r using base learner
        base.predict(ec, k + data.rank);
        float x_dot_r = ec.partial_prediction;
        if (cache_sub_predictions)
          data.sub_predictions[2 * k] = x_dot_r;

        // accumulate prediction
        prediction += (x_dot_l * x_dot_r);
      }
    }
  }
  // restore namespace indices and label
  copy_array(ec.indices, data.predict_indices);

  // finalize prediction
  ec.partial_prediction = prediction;
  ec.pred.scalar = GD::finalize_prediction(data.all->sd, ec.partial_prediction);
}